

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

int __thiscall Imf_3_3::TiledOutputFile::numYTiles(TiledOutputFile *this,int ly)

{
  ostream *poVar1;
  char *pcVar2;
  LogicExc *this_00;
  int in_ESI;
  long in_RDI;
  stringstream _iex_throw_s;
  stringstream *in_stack_fffffffffffffe28;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  if ((-1 < in_ESI) && (in_ESI < *(int *)(*(long *)(in_RDI + 8) + 0xa0))) {
    return *(int *)(*(long *)(*(long *)(in_RDI + 8) + 0xb0) + (long)in_ESI * 4);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"Error calling numXTiles() on image file \"");
  pcVar2 = OStream::fileName((OStream *)0x19f0a4);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"\" (Argument is not in valid range).");
  this_00 = (LogicExc *)__cxa_allocate_exception(0x48);
  Iex_3_3::LogicExc::LogicExc(this_00,in_stack_fffffffffffffe28);
  __cxa_throw(this_00,&Iex_3_3::LogicExc::typeinfo,Iex_3_3::LogicExc::~LogicExc);
}

Assistant:

int
TiledOutputFile::numYTiles (int ly) const
{
    if (ly < 0 || ly >= _data->numYLevels)
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Error calling numXTiles() on image "
            "file \""
                << _streamData->os->fileName ()
                << "\" "
                   "(Argument is not in valid range).");

    return _data->numYTiles[ly];
}